

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::MakeRational(ON_NurbsCurve *this)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  int local_44;
  int local_38;
  int local_34;
  int j;
  int cvi;
  double *new_cv;
  double *old_cv;
  int new_stride;
  int cv_count;
  int dim;
  ON_NurbsCurve *this_local;
  
  bVar2 = IsRational(this);
  if (!bVar2) {
    iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
    local_34 = CVCount(this);
    if (((0 < local_34) && (iVar3 <= this->m_cv_stride)) && (0 < iVar3)) {
      if (this->m_cv_stride == iVar3) {
        local_44 = iVar3 + 1;
      }
      else {
        local_44 = this->m_cv_stride;
      }
      ReserveCVCapacity(this,local_34 * local_44);
      while (local_34 = local_34 + -1, -1 < local_34) {
        pdVar4 = CV(this,local_34);
        pdVar1 = this->m_cv;
        local_38 = iVar3;
        while (local_38 = local_38 + -1, -1 < local_38) {
          pdVar1[(long)(local_34 * local_44) + (long)local_38] = pdVar4[local_38];
        }
        pdVar1[(long)(local_34 * local_44) + (long)iVar3] = 1.0;
      }
      this->m_cv_stride = local_44;
      this->m_is_rat = 1;
    }
  }
  bVar2 = IsRational(this);
  return bVar2;
}

Assistant:

bool ON_NurbsCurve::MakeRational()
{
  if ( !IsRational() ) {
    const int dim = Dimension();
    const int cv_count = CVCount();
    if ( cv_count > 0 && m_cv_stride >= dim && dim > 0 ) {
      const int new_stride = (m_cv_stride == dim) ? dim+1 : m_cv_stride;
      ReserveCVCapacity( cv_count*new_stride );
      const double* old_cv;
      double* new_cv;
      int cvi, j;
      for ( cvi = cv_count-1; cvi>=0; cvi-- ) {
        old_cv = CV(cvi);
        new_cv = m_cv+(cvi*new_stride);
        for ( j = dim-1; j >= 0; j-- ) {
          new_cv[j] = old_cv[j];
        }
        new_cv[dim] = 1.0;
      }
      m_cv_stride = new_stride;
      m_is_rat = 1;
    }
  }
  return IsRational();
}